

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *this,int opcode)

{
  Kind KVar1;
  BinaryReader<mp::internal::IdentityConverter> *pBVar2;
  char *pcVar3;
  int iVar4;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) goto LAB_001fcddf;
    if (KVar1 == FIRST_BINARY_LOGICAL) goto LAB_001fcdd7;
    if (KVar1 == FIRST_RELATIONAL) {
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      return (LogicalExpr)(Impl *)0x0;
    }
switchD_001fcc9b_caseD_3c:
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x22b4ef,&local_28);
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      ReadNumericExpr(this,*pcVar3,false);
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      if ((*pcVar3 != 'o') || (iVar4 = ReadOpCode(this), OpCodeInfo::INFO[iVar4].kind != COUNT)) {
        local_38 = 0;
        uStack_30 = 0;
        local_28.types_ = 0;
        local_28.field_1.values_ = (Value *)&local_38;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x22b4d5,&local_28);
      }
      ReadCountExpr(this);
      break;
    default:
      goto switchD_001fcc9b_caseD_3c;
    case IMPLICATION:
      ReadLogicalExpr(this);
LAB_001fcdd7:
      ReadLogicalExpr(this);
LAB_001fcddf:
      ReadLogicalExpr(this);
      break;
    case EXISTS:
      iVar4 = ReadNumArgs(this,3);
      if (0 < iVar4) {
        do {
          ReadLogicalExpr(this);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      break;
    case ALLDIFF:
      iVar4 = ReadNumArgs(this,1);
      if (0 < iVar4) {
        do {
          pBVar2 = this->reader_;
          pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
          ReadNumericExpr(this,*pcVar3,false);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
    }
  }
  return (LogicalExpr)(Impl *)0x0;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}